

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>
::erase<cs::statement_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>
           *this,key_arg<cs::statement_base_*> *key)

{
  undefined1 auVar1 [16];
  bool bVar2;
  iterator it;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *key;
  it = find<cs::statement_base*>
                 (this,key,SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
                           SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0));
  bVar2 = it.ctrl_ != (ctrl_t *)(*(long *)this + *(long *)(this + 0x18));
  if (bVar2) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
    ::_erase((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base_*>,_phmap::priv::HashEq<cs::statement_base_*,_void>::Hash,_phmap::priv::HashEq<cs::statement_base_*,_void>::Eq,_std::allocator<cs::statement_base_*>_>
              *)this,it);
  }
  return (ulong)bVar2;
}

Assistant:

size_type erase(const key_arg<K>& key)
			{
				auto it = find(key);
				if (it == end()) return 0;
				_erase(it);
				return 1;
			}